

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_crop
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,int x0,int y0,int z0,
          int c0,int x1,int y1,int z1,int c1,bool boundary_conditions)

{
  undefined4 in_EAX;
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  CImg<unsigned_int> *this_00;
  CImgInstanceException *this_01;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  long local_80;
  
  if ((this->_data != (uint *)0x0) &&
     (auVar18._0_4_ = -(uint)(this->_width == 0), auVar18._4_4_ = -(uint)(this->_height == 0),
     auVar18._8_4_ = -(uint)(this->_depth == 0), auVar18._12_4_ = -(uint)(this->_spectrum == 0),
     uVar1 = movmskps(in_EAX,auVar18), (char)uVar1 == '\0')) {
    uVar3 = x1;
    if (x0 < x1) {
      uVar3 = x0;
    }
    uVar5 = x1 ^ x0 ^ uVar3;
    uVar2 = y1;
    if (y0 < y1) {
      uVar2 = y0;
    }
    uVar15 = y1 ^ y0 ^ uVar2;
    uVar11 = z1;
    if (z0 < z1) {
      uVar11 = z0;
    }
    uVar14 = z1 ^ z0 ^ uVar11;
    uVar13 = c1;
    if (c0 < c1) {
      uVar13 = c0;
    }
    uVar16 = c1 ^ c0 ^ uVar13;
    CImg(__return_storage_ptr__,(uVar5 - uVar3) + 1,(uVar15 - uVar2) + 1,(uVar14 - uVar11) + 1,
         (uVar16 - uVar13) + 1);
    if ((((((int)uVar3 < 0) || ((int)uVar2 < 0)) || ((int)this->_width <= (int)uVar5)) ||
        (((int)uVar11 < 0 || ((int)this->_height <= (int)uVar15)))) ||
       (((int)uVar13 < 0 ||
        (((int)this->_depth <= (int)uVar14 ||
         (this_00 = __return_storage_ptr__, (int)this->_spectrum <= (int)uVar16)))))) {
      if (boundary_conditions) {
        uVar3 = __return_storage_ptr__->_spectrum;
        if ((int)uVar3 < 1) {
          return __return_storage_ptr__;
        }
        uVar5 = __return_storage_ptr__->_depth;
        if (x1 < x0) {
          x0 = x1;
        }
        local_80 = 0;
        lVar10 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar3 = __return_storage_ptr__->_height;
            lVar17 = 0;
            lVar9 = 0;
            do {
              if (0 < (int)uVar3) {
                uVar4 = (ulong)__return_storage_ptr__->_width;
                lVar6 = 0;
                lVar8 = 0;
                do {
                  if (0 < (int)uVar4) {
                    lVar7 = 0;
                    do {
                      uVar3 = _atXYZC(this,x0 + (int)lVar7,uVar2 + (int)lVar8,uVar11 + (int)lVar9,
                                      uVar13 + (int)lVar10);
                      *(uint *)((long)__return_storage_ptr__->_data +
                               lVar7 * 4 +
                               (((ulong)__return_storage_ptr__->_depth * local_80 + lVar17) *
                                (ulong)__return_storage_ptr__->_height + lVar6) *
                               (ulong)__return_storage_ptr__->_width) = uVar3;
                      lVar7 = lVar7 + 1;
                      uVar4 = (ulong)(int)__return_storage_ptr__->_width;
                    } while (lVar7 < (long)uVar4);
                    uVar3 = __return_storage_ptr__->_height;
                  }
                  lVar8 = lVar8 + 1;
                  lVar6 = lVar6 + 4;
                } while (lVar8 < (int)uVar3);
                uVar5 = __return_storage_ptr__->_depth;
              }
              lVar9 = lVar9 + 1;
              lVar17 = lVar17 + 4;
            } while (lVar9 < (int)uVar5);
            uVar3 = __return_storage_ptr__->_spectrum;
          }
          lVar10 = lVar10 + 1;
          local_80 = local_80 + 4;
        } while (lVar10 < (int)uVar3);
        return __return_storage_ptr__;
      }
      this_00 = fill(__return_storage_ptr__,0);
    }
    draw_image(this_00,-uVar3,-uVar2,-uVar11,-uVar13,this,1.0);
    return __return_storage_ptr__;
  }
  this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar12 = "non-";
  if (this->_is_shared != false) {
    pcVar12 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_01,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar12,"unsigned int");
  __cxa_throw(this_01,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const bool boundary_conditions=false) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum()) {
        if (boundary_conditions) cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0+x,ny0+y,nz0+z,nc0+c);
        else res.fill(0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      } else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }